

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

par_shapes_mesh * par_shapes_create_disk(float radius,int slices,float *center,float *normal)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  par_shapes_mesh *mesh;
  float *pfVar8;
  uint16_t *puVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long *in_FS_OFFSET;
  bool bVar13;
  undefined8 local_50;
  float local_48;
  float local_40;
  float fStack_3c;
  float local_38;
  
  lVar1 = *in_FS_OFFSET + -0x430;
  mesh = (par_shapes_mesh *)rf_calloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x86),1,0x30);
  mesh->npoints = slices + 1;
  pfVar8 = (float *)(*(code *)in_FS_OFFSET[-0x85])(lVar1,1);
  mesh->points = pfVar8;
  pfVar8[0] = 0.0;
  pfVar8[1] = 0.0;
  pfVar8[2] = 0.0;
  iVar11 = 0;
  if (0 < slices) {
    iVar11 = slices;
  }
  pfVar8 = pfVar8 + 5;
  dVar4 = 0.0;
  iVar12 = iVar11;
  while (bVar13 = iVar12 != 0, iVar12 = iVar12 + -1, bVar13) {
    dVar2 = (double)(float)((dVar4 * 3.14159265359 + dVar4 * 3.14159265359) / (double)slices);
    dVar3 = cos(dVar2);
    pfVar8[-2] = (float)(dVar3 * (double)radius);
    dVar2 = sin(dVar2);
    pfVar8[-1] = (float)(dVar2 * (double)radius);
    *pfVar8 = 0.0;
    dVar4 = dVar4 + 1.0;
    pfVar8 = pfVar8 + 3;
  }
  local_40 = (float)*(undefined8 *)normal;
  fStack_3c = (float)((ulong)*(undefined8 *)normal >> 0x20);
  local_38 = normal[2];
  par_shapes__normalize3(&local_40);
  iVar12 = 1;
  pfVar8 = (float *)(*(code *)in_FS_OFFSET[-0x85])(lVar1,1);
  fVar7 = local_38;
  fVar6 = fStack_3c;
  fVar5 = local_40;
  mesh->normals = pfVar8;
  iVar10 = 0;
  if (0 < mesh->npoints) {
    iVar10 = mesh->npoints;
  }
  while (bVar13 = iVar10 != 0, iVar10 = iVar10 + -1, bVar13) {
    *pfVar8 = local_40;
    *(ulong *)(pfVar8 + 1) = CONCAT44(local_38,fStack_3c);
    pfVar8 = pfVar8 + 3;
  }
  mesh->ntriangles = slices;
  puVar9 = (uint16_t *)(*(code *)in_FS_OFFSET[-0x85])(lVar1,1);
  mesh->triangles = puVar9;
  for (; iVar12 - iVar11 != 1; iVar12 = iVar12 + 1) {
    *puVar9 = 0;
    puVar9[1] = (uint16_t)iVar12;
    puVar9[2] = (short)(iVar12 % slices) + 1;
    puVar9 = puVar9 + 3;
  }
  local_48 = fVar5 * 0.0 + fVar6 * -0.0;
  local_50 = CONCAT44(fVar7 * 0.0 + fVar5,fVar6 * -1.0 + fVar7 * -0.0);
  par_shapes__normalize3((float *)&local_50);
  dVar4 = acos((double)fVar7);
  par_shapes_rotate(mesh,(float)dVar4,(float *)&local_50);
  par_shapes_translate(mesh,*center,center[1],center[2]);
  return mesh;
}

Assistant:

PARDEF par_shapes_mesh* par_shapes_create_disk(float radius, int slices,
                                        float const* center, float const* normal)
{
    par_shapes_mesh* mesh = PAR_CALLOC(par_shapes_mesh, 1);
    mesh->npoints = slices + 1;
    mesh->points = PAR_MALLOC(float, 3 * mesh->npoints);
    float* points = mesh->points;
    *points++ = 0;
    *points++ = 0;
    *points++ = 0;
    for (int i = 0; i < slices; i++) {
        float theta = i * PAR_PI * 2 / slices;
        *points++ = radius * cos(theta);
        *points++ = radius * sin(theta);
        *points++ = 0;
    }
    float nnormal[3] = {normal[0], normal[1], normal[2]};
    par_shapes__normalize3(nnormal);
    mesh->normals = PAR_MALLOC(float, 3 * mesh->npoints);
    float* norms = mesh->normals;
    for (int i = 0; i < mesh->npoints; i++) {
        *norms++ = nnormal[0];
        *norms++ = nnormal[1];
        *norms++ = nnormal[2];
    }
    mesh->ntriangles = slices;
    mesh->triangles = PAR_MALLOC(PAR_SHAPES_T, 3 * mesh->ntriangles);
    PAR_SHAPES_T* triangles = mesh->triangles;
    for (int i = 0; i < slices; i++) {
        *triangles++ = 0;
        *triangles++ = 1 + i;
        *triangles++ = 1 + (i + 1) % slices;
    }
    float k[3] = {0, 0, -1};
    float axis[3];
    par_shapes__cross3(axis, nnormal, k);
    par_shapes__normalize3(axis);
    par_shapes_rotate(mesh, acos(nnormal[2]), axis);
    par_shapes_translate(mesh, center[0], center[1], center[2]);
    return mesh;
}